

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0304(SemanticModelTester *this)

{
  SemanticModel *this_00;
  bool bVar1;
  SyntaxKind SVar2;
  int iVar3;
  DeclarationListSyntax *pDVar4;
  undefined4 extraout_var;
  SpecifierListSyntax *pSVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined4 extraout_var_03;
  TagType *pTVar9;
  Lexeme *pLVar10;
  string local_108;
  string local_e8;
  TagDeclarationSymbol *local_c8;
  StructDeclarationSymbol *strukt;
  TagDeclarationSyntax *nestedNestedtyDeclNode;
  FieldDeclarationSyntax *nestedFldDecl0;
  TagTypeSpecifierSyntax *nestedTySpec;
  TagDeclarationSyntax *nestedtyDeclNode;
  FieldDeclarationSyntax *fldDecl0;
  TagTypeSpecifierSyntax *tySpec;
  type *semaModel;
  type *tyDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nstruct x\n{\n    struct y\n    {\n        struct z { int _ ; } w;\n    } u ;\n} ;\n"
             ,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&tyDeclNode + 7));
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tyDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  semaModel = (type *)std::
                      get<0ul,psy::C::StructOrUnionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                                ((tuple<const_psy::C::StructOrUnionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                                  *)local_20);
  tySpec = (TagTypeSpecifierSyntax *)
           std::get<1ul,psy::C::StructOrUnionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                     ((tuple<const_psy::C::StructOrUnionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                       *)local_20);
  fldDecl0 = (FieldDeclarationSyntax *)
             TagDeclarationSyntax::typeSpecifier((TagDeclarationSyntax *)*semaModel);
  pDVar4 = TagTypeSpecifierSyntax::declarations((TagTypeSpecifierSyntax *)fldDecl0);
  iVar3 = (*(((pDVar4->
              super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
              ).
              super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x1c])();
  nestedtyDeclNode = (TagDeclarationSyntax *)CONCAT44(extraout_var,iVar3);
  pSVar5 = FieldDeclarationSyntax::specifiers((FieldDeclarationSyntax *)nestedtyDeclNode);
  iVar3 = (*(((pSVar5->
              super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
              ).
              super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x36])();
  nestedTySpec = (TagTypeSpecifierSyntax *)
                 TagDeclarationAsSpecifierSyntax::tagDeclaration
                           ((TagDeclarationAsSpecifierSyntax *)CONCAT44(extraout_var_00,iVar3));
  nestedFldDecl0 =
       (FieldDeclarationSyntax *)
       TagDeclarationSyntax::typeSpecifier((TagDeclarationSyntax *)nestedTySpec);
  pDVar4 = TagTypeSpecifierSyntax::declarations((TagTypeSpecifierSyntax *)nestedFldDecl0);
  iVar3 = (*(((pDVar4->
              super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
              ).
              super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x1c])();
  nestedNestedtyDeclNode = (TagDeclarationSyntax *)CONCAT44(extraout_var_01,iVar3);
  pSVar5 = FieldDeclarationSyntax::specifiers((FieldDeclarationSyntax *)nestedNestedtyDeclNode);
  iVar3 = (*(((pSVar5->
              super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
              ).
              super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x36])();
  strukt = (StructDeclarationSymbol *)
           TagDeclarationAsSpecifierSyntax::tagDeclaration
                     ((TagDeclarationAsSpecifierSyntax *)CONCAT44(extraout_var_02,iVar3));
  SVar2 = C::SyntaxNode::kind((SyntaxNode *)strukt);
  if (SVar2 != StructDeclaration) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    SVar2 = C::SyntaxNode::kind((SyntaxNode *)strukt);
    poVar6 = C::operator<<(poVar6,SVar2);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = C::operator<<(poVar6,StructDeclaration);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x212);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  this_00 = (SemanticModel *)
            (tySpec->super_SpecifierSyntax).super_SyntaxNode.super_Managed._vptr_Managed;
  iVar3 = (*(strukt->super_StructOrUnionDeclarationSymbol).super_TagDeclarationSymbol.
            super_TypeDeclarationSymbol.super_DeclarationSymbol.super_Symbol._vptr_Symbol[0xf])();
  local_c8 = (TagDeclarationSymbol *)
             SemanticModel::structFor
                       (this_00,(StructOrUnionDeclarationSyntax *)CONCAT44(extraout_var_03,iVar3));
  if (local_c8 == (TagDeclarationSymbol *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x216);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pTVar9 = TagDeclarationSymbol::introducedNewType(local_c8);
  pLVar10 = &TagType::tag(pTVar9)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_e8,pLVar10);
  bVar1 = std::operator==(&local_e8,"z");
  std::__cxx11::string::~string((string *)&local_e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
  poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
  pTVar9 = TagDeclarationSymbol::introducedNewType(local_c8);
  pLVar10 = &TagType::tag(pTVar9)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_108,pLVar10);
  poVar6 = std::operator<<(poVar6,(string *)&local_108);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
  poVar6 = std::operator<<(poVar6,"z");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\t\t");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                          );
  poVar6 = std::operator<<(poVar6,":");
  pvVar7 = (void *)std::ostream::operator<<(poVar6,0x217);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_108);
  uVar8 = __cxa_allocate_exception(1);
  __cxa_throw(uVar8,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0304()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>(R"(
struct x
{
    struct y
    {
        struct z { int _ ; } w;
    } u ;
} ;
)");

    auto tySpec = tyDeclNode->typeSpecifier();
    auto fldDecl0 = tySpec->declarations()->value->asFieldDeclaration();
    auto nestedtyDeclNode = fldDecl0->specifiers()->value->asTagDeclarationAsSpecifier()->tagDeclaration();

    auto nestedTySpec = nestedtyDeclNode->typeSpecifier();
    auto nestedFldDecl0 = nestedTySpec->declarations()->value->asFieldDeclaration();
    auto nestedNestedtyDeclNode = nestedFldDecl0->specifiers()->value->asTagDeclarationAsSpecifier()->tagDeclaration();
    PSY_EXPECT_EQ_ENU(nestedNestedtyDeclNode->kind(),
                      SyntaxKind::StructDeclaration,
                      SyntaxKind);

    const StructDeclarationSymbol* strukt =
            semaModel->structFor(nestedNestedtyDeclNode->asStructOrUnionDeclaration());
    PSY_EXPECT_TRUE(strukt);
    PSY_EXPECT_EQ_STR(strukt->introducedNewType()->tag()->valueText(), "z");
}